

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O0

qreal __thiscall KDReports::SpreadsheetReportLayout::totalWidth(SpreadsheetReportLayout *this)

{
  qsizetype qVar1;
  const_reference pdVar2;
  qreal qVar3;
  int local_1c;
  double dStack_18;
  int col;
  qreal totalWidth;
  SpreadsheetReportLayout *this_local;
  
  dStack_18 = 0.0;
  local_1c = 0;
  while( true ) {
    qVar1 = QList<double>::size(&(this->m_tableLayout).m_columnWidths);
    if (qVar1 <= local_1c) break;
    pdVar2 = QList<double>::operator[](&(this->m_tableLayout).m_columnWidths,(long)local_1c);
    dStack_18 = *pdVar2 + dStack_18;
    local_1c = local_1c + 1;
  }
  if (((this->m_tableLayout).m_verticalHeaderVisible & 1U) != 0) {
    qVar3 = TableLayout::vHeaderWidth(&this->m_tableLayout);
    dStack_18 = qVar3 + dStack_18;
  }
  return dStack_18;
}

Assistant:

qreal KDReports::SpreadsheetReportLayout::totalWidth() const
{
    qreal totalWidth = 0;
    for (int col = 0; col < m_tableLayout.m_columnWidths.size(); ++col) {
        totalWidth += m_tableLayout.m_columnWidths[col];
    }
    if (m_tableLayout.m_verticalHeaderVisible)
        totalWidth += m_tableLayout.vHeaderWidth();
    return totalWidth;
}